

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

void __thiscall ghc::net::uri::~uri(uri *this)

{
  uri *this_local;
  
  this->_vptr_uri = (_func_int **)&PTR__uri_00362100;
  std::__cxx11::string::~string((string *)&this->_fragment);
  std::__cxx11::string::~string((string *)&this->_query);
  std::__cxx11::string::~string((string *)&this->_path);
  std::__cxx11::string::~string((string *)&this->_host);
  std::__cxx11::string::~string((string *)&this->_userInfo);
  std::__cxx11::string::~string((string *)&this->_scheme);
  return;
}

Assistant:

GHC_INLINE uri::~uri() {}